

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

void __thiscall
clipp::group::child_t<clipp::parameter,_clipp::group>::child_t
          (child_t<clipp::parameter,_clipp::group> *this,
          child_t<clipp::parameter,_clipp::group> *src)

{
  data dVar1;
  long in_RSI;
  data *in_RDI;
  parameter *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  
  data::data(in_RDI);
  in_RDI[0x100] = *(data *)(in_RSI + 0x100);
  dVar1 = in_RDI[0x100];
  if ((dVar1 == (data)0x0) || (dVar1 != (data)0x1)) {
    data::data((data *)CONCAT17(dVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  }
  else {
    data::data((data *)CONCAT17(1,in_stack_ffffffffffffffe0),(group *)in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

child_t(child_t&& src) noexcept : type_{src.type_} {
            switch(type_) {
                default:
                case type::param: new(&m_)data{std::move(src.m_.param)}; break;
                case type::group: new(&m_)data{std::move(src.m_.group)}; break;
            }
        }